

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  long in_RDI;
  stbtt_vertex **in_stack_00000048;
  int in_stack_00000054;
  stbtt_fontinfo *in_stack_00000058;
  stbtt_vertex **in_stack_000000d0;
  int in_stack_000000dc;
  stbtt_fontinfo *in_stack_000000e0;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x4c) == 0) {
    local_4 = stbtt__GetGlyphShapeTT(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0);
  }
  else {
    local_4 = stbtt__GetGlyphShapeT2(in_stack_00000058,in_stack_00000054,in_stack_00000048);
  }
  return local_4;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
if (!info->cff.size)
return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
else
return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}